

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# script.c
# Opt level: O2

size_t scriptint_get_length(int64_t signed_v)

{
  long lVar1;
  ulong uVar2;
  
  lVar1 = 0;
  uVar2 = 0;
  for (; signed_v != 0; signed_v = (ulong)signed_v >> 8) {
    uVar2 = signed_v & 0xff;
    lVar1 = lVar1 + 1;
  }
  return (ulong)(0x7f < (uint)uVar2) + lVar1;
}

Assistant:

static size_t scriptint_get_length(int64_t signed_v)
{
    uint64_t v = signed_v < 0 ? -signed_v : signed_v;
    size_t len = 0;
    unsigned char last = 0;

    while (v) {
        last = v & 0xff;
        len += 1;
        v >>= 8;
    }
    return len + (last & 0x80 ? 1 : 0);
}